

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O2

char * Fantasy_Character_parse_json_union
                 (flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t type,
                 flatcc_builder_ref_t *result)

{
  int32_t iVar1;
  int iVar2;
  uint64_t uVar3;
  char *buf_00;
  int *piVar4;
  void *struct_base;
  char *pcVar5;
  undefined7 in_register_00000009;
  int iStack_50;
  int32_t local_44;
  int *local_40;
  int more;
  
  *result = 0;
  switch(CONCAT71(in_register_00000009,type) & 0xffffffff) {
  case 0:
    pcVar5 = flatcc_json_parser_none(ctx,buf,end);
    return pcVar5;
  case 1:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    goto switchD_00110c4a_caseD_1;
  case 2:
    *result = 0;
    iVar2 = flatcc_builder_start_table(ctx->ctx,1);
    if (iVar2 == 0) {
      local_40 = result;
      buf = flatcc_json_parser_object_start(ctx,buf,end,&more);
LAB_00110cd6:
      if (more == 0) goto LAB_00110e9f;
      pcVar5 = flatcc_json_parser_symbol_start(ctx,buf,end);
      uVar3 = flatcc_json_parser_symbol_part(pcVar5,end);
      if (uVar3 == 0x73776f72645f6174) {
        buf_00 = pcVar5 + 8;
        uVar3 = flatcc_json_parser_symbol_part(buf_00,end);
        if (uVar3 == 0x7461636b5f64616d) {
          pcVar5 = pcVar5 + 0x10;
          uVar3 = flatcc_json_parser_symbol_part(pcVar5,end);
          buf_00 = pcVar5;
          if (((uint)(uVar3 >> 0x28) == 0x616765) &&
             (buf_00 = flatcc_json_parser_match_symbol(ctx,pcVar5,end,3), pcVar5 != buf_00)) {
            local_44 = 0;
            buf = flatcc_json_parser_int32(ctx,buf_00,end,&local_44);
            if ((buf_00 == buf) &&
               ((buf = flatcc_json_parser_symbolic_int32
                                 (ctx,buf,end,
                                  (flatcc_json_parser_integral_symbol_f **)
                                  Fantasy_Attacker_parse_json_table_symbolic_parsers,&local_44),
                result = local_40, buf == buf_00 || (buf == end)))) goto LAB_00110ec1;
            iVar1 = local_44;
            if ((local_44 == 0) && ((ctx->flags & 2) == 0)) goto LAB_00110e16;
            piVar4 = (int *)flatcc_builder_table_add(ctx->ctx,0,4,4);
            result = local_40;
            if (piVar4 == (int *)0x0) goto LAB_00110ec1;
            *piVar4 = iVar1;
            goto LAB_00110e16;
          }
        }
        buf = flatcc_json_parser_unmatched_symbol(ctx,buf_00,end);
      }
      else {
        buf = flatcc_json_parser_unmatched_symbol(ctx,pcVar5,end);
      }
LAB_00110e16:
      buf = flatcc_json_parser_object_end(ctx,buf,end,&more);
      goto LAB_00110cd6;
    }
    goto LAB_00110ec1;
  case 8:
    struct_base = flatcc_builder_start_struct(ctx->ctx,8,4);
    if ((struct_base != (void *)0x0) &&
       (buf = Fantasy_Rapunzel_parse_json_struct_inline(ctx,buf,end,struct_base), ctx->error == 0))
    {
      iVar2 = flatcc_builder_end_struct(ctx->ctx);
      goto LAB_00110eba;
    }
LAB_00110ec1:
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
    break;
  case 9:
  case 10:
    buf = Fantasy_BookReader_parse_json_struct(ctx,buf,end,result);
    break;
  case 0xb:
switchD_00110c4a_caseD_b:
    buf = flatcc_json_parser_build_string(ctx,buf,end,result);
    break;
  default:
    if ((int)CONCAT71(in_register_00000009,type) == 0xff) goto switchD_00110c4a_caseD_b;
    goto switchD_00110c4a_caseD_1;
  }
LAB_00110ed5:
  if ((ctx->error != 0) || (*result != 0)) {
    return buf;
  }
  iStack_50 = 0x23;
LAB_00110ef6:
  pcVar5 = flatcc_json_parser_set_error(ctx,buf,end,iStack_50);
  return pcVar5;
LAB_00110e9f:
  result = local_40;
  if (ctx->error == 0) {
    iVar2 = flatcc_builder_end_table(ctx->ctx);
    result = local_40;
LAB_00110eba:
    *result = iVar2;
    if (iVar2 != 0) goto LAB_00110ed5;
  }
  goto LAB_00110ec1;
switchD_00110c4a_caseD_1:
  if ((ctx->flags & 1) != 0) {
    pcVar5 = flatcc_json_parser_generic_json(ctx,buf,end);
    return pcVar5;
  }
  iStack_50 = 0xf;
  goto LAB_00110ef6;
}

Assistant:

static const char *Fantasy_Character_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)
{

    *result = 0;
    switch (type) {
    case 0: /* NONE */
        return flatcc_json_parser_none(ctx, buf, end);
    case 2: /* MuLan */
        buf = Fantasy_Attacker_parse_json_table(ctx, buf, end, result);
        break;
    case 8: /* Rapunzel */
        buf = Fantasy_Rapunzel_parse_json_struct(ctx, buf, end, result);
        break;
    case 9: /* Belle */
        buf = Fantasy_BookReader_parse_json_struct(ctx, buf, end, result);
        break;
    case 10: /* BookFan */
        buf = Fantasy_BookReader_parse_json_struct(ctx, buf, end, result);
        break;
    case 11: /* Other */
        buf = flatcc_json_parser_build_string(ctx, buf, end, result);
        break;
    case 255: /* Unused */
        buf = flatcc_json_parser_build_string(ctx, buf, end, result);
        break;
    default:
        if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
        } else {
            return flatcc_json_parser_generic_json(ctx, buf, end);
        }
    }
    if (ctx->error) return buf;
    if (!*result) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
    }
    return buf;
}